

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

void entry_list_free(entry_list *list)

{
  match_file *pmVar1;
  match_file *q;
  match_file *p;
  entry_list *list_local;
  
  q = list->first;
  while (q != (match_file *)0x0) {
    pmVar1 = q->next;
    archive_mstring_clean(&q->pathname);
    free(q);
    q = pmVar1;
  }
  return;
}

Assistant:

static void
entry_list_free(struct entry_list *list)
{
	struct match_file *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pathname));
		free(q);
	}
}